

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::fixup_anonymous_struct_names
          (CompilerGLSL *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *visited,SPIRType *type)

{
  uint32_t id;
  uint uVar1;
  TypedID<(spirv_cross::Types)1> TVar2;
  size_type sVar3;
  size_t sVar4;
  TypedID *this_00;
  SPIRType *pSVar5;
  string *ts_1;
  byte local_a5;
  spirv_cross local_70 [8];
  string anon_name;
  SPIRType *mbr_type;
  uint32_t i;
  uint32_t local_28;
  uint32_t local_24;
  SPIRType *local_20;
  SPIRType *type_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *visited_local;
  CompilerGLSL *this_local;
  
  local_20 = type;
  type_local = (SPIRType *)visited;
  visited_local =
       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        *)this;
  local_24 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
  sVar3 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(visited,&local_24);
  pSVar5 = type_local;
  if (sVar3 == 0) {
    local_28 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_20->super_IVariant).self);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)pSVar5,&local_28);
    for (mbr_type._4_4_ = 0;
        sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                          (&(local_20->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
        mbr_type._4_4_ < (uint)sVar4; mbr_type._4_4_ = mbr_type._4_4_ + 1) {
      this_00 = (TypedID *)
                VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                          (&(local_20->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                           (ulong)mbr_type._4_4_);
      id = TypedID::operator_cast_to_unsigned_int(this_00);
      pSVar5 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
      if (*(int *)&(pSVar5->super_IVariant).field_0xc == 0xf) {
        Compiler::get_name_abi_cxx11_(&this->super_Compiler,(ID)(pSVar5->super_IVariant).self.id);
        uVar1 = ::std::__cxx11::string::empty();
        local_a5 = 0;
        if ((uVar1 & 1) != 0) {
          TVar2 = TypedID::operator_cast_to_TypedID((TypedID *)&(local_20->super_IVariant).self);
          Compiler::get_member_name_abi_cxx11_
                    (&this->super_Compiler,(TypeID)TVar2.id,mbr_type._4_4_);
          local_a5 = ::std::__cxx11::string::empty();
          local_a5 = local_a5 ^ 0xff;
        }
        if ((local_a5 & 1) != 0) {
          TVar2 = TypedID::operator_cast_to_TypedID((TypedID *)&(local_20->super_IVariant).self);
          ts_1 = Compiler::get_member_name_abi_cxx11_
                           (&this->super_Compiler,(TypeID)TVar2.id,mbr_type._4_4_);
          join<char_const(&)[6],std::__cxx11::string_const&>(local_70,(char (*) [6])"anon_",ts_1);
          ParsedIR::sanitize_underscores((string *)local_70);
          Compiler::set_name(&this->super_Compiler,(ID)(pSVar5->super_IVariant).self.id,
                             (string *)local_70);
          ::std::__cxx11::string::~string((string *)local_70);
        }
        fixup_anonymous_struct_names
                  (this,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)type_local,pSVar5);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::fixup_anonymous_struct_names(std::unordered_set<uint32_t> &visited, const SPIRType &type)
{
	if (visited.count(type.self))
		return;
	visited.insert(type.self);

	for (uint32_t i = 0; i < uint32_t(type.member_types.size()); i++)
	{
		auto &mbr_type = get<SPIRType>(type.member_types[i]);

		if (mbr_type.basetype == SPIRType::Struct)
		{
			// If there are multiple aliases, the output might be somewhat unpredictable,
			// but the only real alternative in that case is to do nothing, which isn't any better.
			// This check should be fine in practice.
			if (get_name(mbr_type.self).empty() && !get_member_name(type.self, i).empty())
			{
				auto anon_name = join("anon_", get_member_name(type.self, i));
				ParsedIR::sanitize_underscores(anon_name);
				set_name(mbr_type.self, anon_name);
			}

			fixup_anonymous_struct_names(visited, mbr_type);
		}
	}
}